

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O0

MemoryClass * __thiscall MMIntern::MemoryClass::operator>>(MemoryClass *this,float *v)

{
  size_t sVar1;
  size_type sVar2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  char *local_40;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  undefined8 local_28;
  size_t typeSize;
  float *v_local;
  MemoryClass *this_local;
  
  local_28 = 4;
  sVar1 = this->readPos;
  typeSize = (size_t)v;
  v_local = (float *)this;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->mem);
  if (sVar1 + 4 <= sVar2) {
    local_38._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&this->mem);
    local_30 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator+(&local_38,this->readPos);
    local_50._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&this->mem);
    local_48 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator+(&local_50,this->readPos);
    local_40 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator+(&local_48,4);
    std::copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char*>
              (local_30,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                        local_40,(char *)typeSize);
    this->readPos = this->readPos + 4;
  }
  return this;
}

Assistant:

MMIntern::MemoryClass& MMIntern::MemoryClass::operator>>(T& v)
{
    constexpr std::size_t typeSize = sizeof(T);
    
    if (readPos + typeSize > mem.size())                // in case reading exceeds mem blocks...
    {                                                   //   (maybe cout something)
        return *this;
    }
    
    std::copy(mem.begin() + readPos, mem.begin() + readPos + typeSize, reinterpret_cast<char*>(&v)); 
    readPos += typeSize;
    return *this;
}